

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::
createExternIfaceMethod<slang::syntax::ModportSubroutinePortSyntax>
          (Scope *scope,ModportSubroutinePortSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *args;
  FunctionPrototypeSyntax *pFVar2;
  Scope *parent;
  bitmask<slang::ast::MethodFlags> bVar3;
  int iVar4;
  MethodPrototypeSymbol *prototype;
  undefined4 extraout_var;
  SubroutineSymbol *pSVar5;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_00;
  size_t extraout_RDX_00;
  SubroutineKind subroutineKind;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  Token nameToken;
  MethodFlags local_9a;
  Scope *local_98;
  Visibility local_90;
  SubroutineKind local_8c;
  SourceLocation local_88;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_80 [2];
  Token local_40;
  
  args = scope->compilation;
  pFVar2 = (syntax->prototype).ptr;
  local_98 = scope;
  local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(pFVar2->name).ptr);
  local_8c = (SubroutineKind)((pFVar2->keyword).kind == TaskKeyword);
  local_80[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&local_40);
  local_88 = parsing::Token::location(&local_40);
  local_90 = Public;
  local_9a = InterfaceExtern;
  prototype = BumpAllocator::
              emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility,slang::ast::MethodFlags>
                        (&args->super_BumpAllocator,args,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_80,&local_88,
                         &local_8c,&local_90,&local_9a);
  parent = local_98;
  (prototype->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  if (local_8c == Function) {
    (prototype->declaredReturnType).typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar2->returnType).ptr;
    puVar1 = &(prototype->declaredReturnType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
  }
  else {
    (prototype->declaredReturnType).type = args->voidType;
  }
  local_80[0].len = 0;
  local_80[0].data_ = (pointer)((long)local_80 + 0x18U);
  local_80[0].cap = 5;
  syntax_00 = pFVar2->portList;
  if (syntax_00 != (FunctionPortListSyntax *)0x0) {
    bVar3 = SubroutineSymbol::buildArguments
                      (&prototype->super_Scope,local_98,syntax_00,Automatic,local_80);
    (prototype->flags).m_bits = (prototype->flags).m_bits | bVar3.m_bits;
    syntax_00 = extraout_RDX;
  }
  iVar4 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                    (local_80,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)syntax_00);
  (prototype->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
  (prototype->arguments)._M_extent._M_extent_value = extraout_RDX_00;
  pSVar5 = SubroutineSymbol::createFromPrototype(args,prototype,parent);
  (prototype->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value
       = pSVar5;
  if ((prototype->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>
      ._M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
      false) {
    (prototype->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = true;
  }
  if (local_80[0].data_ != (pointer)((long)local_80 + 0x18U)) {
    operator_delete(local_80[0].data_);
  }
  return prototype;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::createExternIfaceMethod(const Scope& scope,
                                                                      const TSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto nameToken = proto.name->getLastToken();
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    auto result = comp.emplace<MethodPrototypeSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location(), subroutineKind,
                                                      Visibility::Public,
                                                      MethodFlags::InterfaceExtern);

    result->setSyntax(syntax);

    if (subroutineKind == SubroutineKind::Function)
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, scope, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    result->arguments = arguments.copy(comp);
    result->subroutine = &SubroutineSymbol::createFromPrototype(comp, *result, scope);
    return *result;
}